

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::current_path(path *p)

{
  bool bVar1;
  undefined8 uVar2;
  path *in_stack_00000030;
  string *in_stack_00000038;
  filesystem_error *in_stack_00000040;
  error_code in_stack_00000048;
  error_code ec;
  int in_stack_000001ec;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  error_code *in_stack_ffffffffffffffc8;
  path *in_stack_ffffffffffffffd0;
  error_code local_18;
  
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  current_path(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(&local_18);
  detail::systemErrorText<int>(in_stack_000001ec);
  filesystem_error::filesystem_error
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000048);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void current_path(const path& p)
{
    std::error_code ec;
    current_path(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
}